

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

bool __thiscall Jupiter::IRC::Client::registerClient(Client *this)

{
  char *pcVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  pointer pcVar4;
  int __flags;
  string message;
  string local_40;
  
  pcVar1 = Socket::getLocalHostname();
  pcVar4 = (this->m_nickname)._M_dataplus._M_p;
  string_printf_abi_cxx11_
            (&message,"USER %.*s %s %.*s :%.*s\r\n",(this->m_nickname)._M_string_length,pcVar4,
             pcVar1,(this->m_server_hostname)._M_string_length,
             (this->m_server_hostname)._M_dataplus._M_p,(this->m_realname)._M_string_length,
             (this->m_realname)._M_dataplus._M_p);
  __flags = (int)pcVar1;
  sVar2 = Socket::send((this->m_socket)._M_t.
                       super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>
                       .super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl,
                       (int)message._M_string_length,message._M_dataplus._M_p,(size_t)pcVar4,__flags
                      );
  pcVar4 = (this->m_nickname)._M_dataplus._M_p;
  string_printf_abi_cxx11_(&local_40,"NICK %.*s\r\n",(this->m_nickname)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&message,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  sVar3 = Socket::send((this->m_socket)._M_t.
                       super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>
                       .super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl,
                       (int)message._M_string_length,message._M_dataplus._M_p,(size_t)pcVar4,__flags
                      );
  this->m_connection_status = 3;
  std::__cxx11::string::~string((string *)&message);
  return 0 < (int)sVar3 && 0 < (int)sVar2;
}

Assistant:

bool Jupiter::IRC::Client::registerClient() {
	bool result = true;
	const char *localHostname = Jupiter::Socket::getLocalHostname();
	std::string message = string_printf("USER %.*s %s %.*s :%.*s" ENDL, m_nickname.size(), m_nickname.data(), localHostname, m_server_hostname.size(), m_server_hostname.c_str(), m_realname.size(), m_realname.data());
	
	if (m_socket->send(message) <= 0)
		result = false;

	message = string_printf("NICK %.*s" ENDL, m_nickname.size(), m_nickname.data());

	if (m_socket->send(message) <= 0)
		result = false;

	m_connection_status = 3;
	return result;
}